

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory_test.cc
# Opt level: O3

int main(void)

{
  pointer pcVar1;
  int iVar2;
  ComplexFactory *this;
  SimpleFactory *this_00;
  Shape *pSVar3;
  string name;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  this = (ComplexFactory *)operator_new(8);
  (this->super_AbstractFactory)._vptr_AbstractFactory =
       (_func_int **)&PTR_createCurvedInstance_00103d68;
  this_00 = (SimpleFactory *)operator_new(8);
  (this_00->super_AbstractFactory)._vptr_AbstractFactory =
       (_func_int **)&PTR_createCurvedInstance_00103da8;
  pSVar3 = SimpleFactory::createCurvedInstance(this_00);
  pcVar1 = (pSVar3->value)._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + (pSVar3->value)._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_58);
  if (iVar2 != 0) {
    __assert_fail("name == \"circle\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/abstract_factory_test.cc"
                  ,0xd,"int main()");
  }
  pSVar3 = ComplexFactory::createCurvedInstance(this);
  pcVar1 = (pSVar3->value)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (pSVar3->value)._M_string_length);
  std::__cxx11::string::operator=((string *)local_58,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)local_58);
  if (iVar2 == 0) {
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    return 0;
  }
  __assert_fail("name == \"ellipse\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/abstract_factory_test.cc"
                ,0x11,"int main()");
}

Assistant:

int main() {
  AbstractFactory *complexFactry = new ComplexFactory;
  AbstractFactory *simpleFactry = new SimpleFactory;

  Shape *simpleShape = simpleFactry->createCurvedInstance();
  std::string name = simpleShape->getValue();
  assert(name == "circle");

  Shape *complexShape = complexFactry->createCurvedInstance();
  name = complexShape->getValue();
  assert(name == "ellipse");
}